

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::detail::ClassSpecializationKey::ClassSpecializationKey
          (ClassSpecializationKey *this,
          span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues,
          span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams)

{
  ConstantValue *this_00;
  Type *this_01;
  long lVar1;
  size_t h;
  size_t local_48;
  size_t local_40;
  ClassSpecializationKey *local_38;
  
  (this->paramValues)._M_ptr = paramValues._M_ptr;
  (this->paramValues)._M_extent._M_extent_value =
       paramValues._M_extent._M_extent_value._M_extent_value;
  (this->typeParams)._M_ptr = typeParams._M_ptr;
  (this->typeParams)._M_extent._M_extent_value =
       typeParams._M_extent._M_extent_value._M_extent_value;
  local_40 = 0;
  local_38 = this;
  for (lVar1 = 0; paramValues._M_extent._M_extent_value._M_extent_value << 3 != lVar1;
      lVar1 = lVar1 + 8) {
    this_00 = *(ConstantValue **)((long)paramValues._M_ptr + lVar1);
    if (this_00 == (ConstantValue *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = ConstantValue::hash(this_00);
    }
    hash_combine<unsigned_long>(&local_40,&local_48);
  }
  for (lVar1 = 0; typeParams._M_extent._M_extent_value._M_extent_value << 3 != lVar1;
      lVar1 = lVar1 + 8) {
    this_01 = *(Type **)((long)typeParams._M_ptr + lVar1);
    if (this_01 == (Type *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = Type::hash(this_01);
    }
    hash_combine<unsigned_long>(&local_40,&local_48);
  }
  local_38->savedHash = local_40;
  return;
}

Assistant:

ClassSpecializationKey::ClassSpecializationKey(std::span<const ConstantValue* const> paramValues,
                                               std::span<const Type* const> typeParams) :
    paramValues(paramValues), typeParams(typeParams) {

    // Precompute the hash.
    size_t h = 0;
    for (auto val : paramValues)
        hash_combine(h, val ? val->hash() : 0);
    for (auto type : typeParams)
        hash_combine(h, type ? type->hash() : 0);
    savedHash = h;
}